

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O3

void MRIStepCoupling_Free(MRIStepCoupling MRIC)

{
  int iVar1;
  sunrealtype **ppsVar2;
  sunrealtype ***pppsVar3;
  long lVar4;
  long lVar5;
  
  if (MRIC != (MRIStepCoupling)0x0) {
    if (MRIC->c != (sunrealtype *)0x0) {
      free(MRIC->c);
    }
    pppsVar3 = MRIC->W;
    if (pppsVar3 != (sunrealtype ***)0x0) {
      iVar1 = MRIC->nmat;
      if (0 < iVar1) {
        lVar4 = 0;
        do {
          ppsVar2 = MRIC->W[lVar4];
          if (ppsVar2 != (sunrealtype **)0x0) {
            iVar1 = MRIC->stages;
            if (0 < iVar1) {
              lVar5 = 0;
              do {
                if (MRIC->W[lVar4][lVar5] != (sunrealtype *)0x0) {
                  free(MRIC->W[lVar4][lVar5]);
                  MRIC->W[lVar4][lVar5] = (sunrealtype *)0x0;
                  iVar1 = MRIC->stages;
                }
                lVar5 = lVar5 + 1;
              } while (lVar5 < iVar1);
              ppsVar2 = MRIC->W[lVar4];
            }
            free(ppsVar2);
            MRIC->W[lVar4] = (sunrealtype **)0x0;
            iVar1 = MRIC->nmat;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < iVar1);
        pppsVar3 = MRIC->W;
      }
      free(pppsVar3);
    }
    pppsVar3 = MRIC->G;
    if (pppsVar3 != (sunrealtype ***)0x0) {
      iVar1 = MRIC->nmat;
      if (0 < iVar1) {
        lVar4 = 0;
        do {
          ppsVar2 = MRIC->G[lVar4];
          if (ppsVar2 != (sunrealtype **)0x0) {
            iVar1 = MRIC->stages;
            if (0 < iVar1) {
              lVar5 = 0;
              do {
                if (MRIC->G[lVar4][lVar5] != (sunrealtype *)0x0) {
                  free(MRIC->G[lVar4][lVar5]);
                  MRIC->G[lVar4][lVar5] = (sunrealtype *)0x0;
                  iVar1 = MRIC->stages;
                }
                lVar5 = lVar5 + 1;
              } while (lVar5 < iVar1);
              ppsVar2 = MRIC->G[lVar4];
            }
            free(ppsVar2);
            MRIC->G[lVar4] = (sunrealtype **)0x0;
            iVar1 = MRIC->nmat;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < iVar1);
        pppsVar3 = MRIC->G;
      }
      free(pppsVar3);
    }
    free(MRIC);
    return;
  }
  return;
}

Assistant:

void MRIStepCoupling_Free(MRIStepCoupling MRIC)
{
  int k, i;

  /* Free each field within MRIStepCoupling structure, and then
     free structure itself */
  if (MRIC)
  {
    if (MRIC->c) { free(MRIC->c); }

    if (MRIC->W)
    {
      for (k = 0; k < MRIC->nmat; k++)
      {
        if (MRIC->W[k])
        {
          for (i = 0; i < MRIC->stages; i++)
          {
            if (MRIC->W[k][i])
            {
              free(MRIC->W[k][i]);
              MRIC->W[k][i] = NULL;
            }
          }
          free(MRIC->W[k]);
          MRIC->W[k] = NULL;
        }
      }
      free(MRIC->W);
    }

    if (MRIC->G)
    {
      for (k = 0; k < MRIC->nmat; k++)
      {
        if (MRIC->G[k])
        {
          for (i = 0; i < MRIC->stages; i++)
          {
            if (MRIC->G[k][i])
            {
              free(MRIC->G[k][i]);
              MRIC->G[k][i] = NULL;
            }
          }
          free(MRIC->G[k]);
          MRIC->G[k] = NULL;
        }
      }
      free(MRIC->G);
    }

    free(MRIC);
  }
}